

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint error_3;
  uint error_2;
  uint error_1;
  uint error;
  LodePNGInfo *source_local;
  LodePNGInfo *dest_local;
  
  lodepng_info_cleanup(dest);
  memcpy(dest,source,0xe8);
  lodepng_color_mode_init(&dest->color);
  dest_local._4_4_ = lodepng_color_mode_copy(&dest->color,&source->color);
  if (((dest_local._4_4_ == 0) &&
      (dest_local._4_4_ = LodePNGText_copy(dest,source), dest_local._4_4_ == 0)) &&
     (dest_local._4_4_ = LodePNGIText_copy(dest,source), dest_local._4_4_ == 0)) {
    LodePNGUnknownChunks_init(dest);
    dest_local._4_4_ = LodePNGUnknownChunks_copy(dest,source);
    if (dest_local._4_4_ == 0) {
      dest_local._4_4_ = 0;
    }
  }
  return dest_local._4_4_;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source)
{
  lodepng_info_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->color);
  CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
  CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));

  LodePNGUnknownChunks_init(dest);
  CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  return 0;
}